

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

string * __thiscall
leveldb::Harness::PickRandomKey
          (string *__return_storage_ptr__,Harness *this,Random *rnd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  char cVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pcVar4;
  Comparator *pCVar5;
  size_type sVar6;
  uint uVar7;
  ulong uVar8;
  Comparator *pCVar9;
  uint uVar10;
  int iVar11;
  Slice *key;
  Slice *key_00;
  string rev;
  string local_80;
  string local_60;
  pointer local_40;
  size_type sStack_38;
  
  pbVar2 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"foo","");
  }
  else {
    uVar8 = (ulong)rnd->seed_ * 0x41a7;
    uVar10 = (int)(uVar8 >> 0x1f) + ((uint)uVar8 & 0x7fffffff);
    uVar7 = uVar10 + 0x80000001;
    if (-1 < (int)uVar10) {
      uVar7 = uVar10;
    }
    rnd->seed_ = uVar7;
    iVar11 = (int)((ulong)uVar7 % ((ulong)((long)pbVar3 - (long)pbVar2) >> 5 & 0xffffffff));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = pbVar2[iVar11]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + pbVar2[iVar11]._M_string_length);
    uVar8 = (ulong)rnd->seed_ * 0x41a7;
    uVar10 = (int)(uVar8 >> 0x1f) + ((uint)uVar8 & 0x7fffffff);
    uVar7 = uVar10 + 0x80000001;
    if (-1 < (int)uVar10) {
      uVar7 = uVar10;
    }
    rnd->seed_ = uVar7;
    if (uVar7 % 3 == 1) {
      sVar6 = __return_storage_ptr__->_M_string_length;
      if (sVar6 != 0) {
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        cVar1 = pcVar4[sVar6 - 1];
        if ('\0' < cVar1) {
          pcVar4[sVar6 - 1] = cVar1 + -1;
        }
      }
    }
    else if (uVar7 % 3 == 2) {
      pCVar5 = (this->options_).comparator;
      pCVar9 = BytewiseComparator();
      if (pCVar9 == pCVar5) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (pCVar5 != (Comparator *)&reverse_key_comparator) {
          __assert_fail("cmp == &reverse_key_comparator",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
                        ,0x46,"void leveldb::Increment(const Comparator *, std::string *)");
        }
        local_60._M_dataplus._M_p = (__return_storage_ptr__->_M_dataplus)._M_p;
        local_60._M_string_length = __return_storage_ptr__->_M_string_length;
        Reverse_abi_cxx11_(&local_80,(leveldb *)&local_60,key);
        std::__cxx11::string::push_back((char)&local_80);
        local_40 = local_80._M_dataplus._M_p;
        sStack_38 = local_80._M_string_length;
        Reverse_abi_cxx11_(&local_60,(leveldb *)&local_40,key_00);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PickRandomKey(Random* rnd, const std::vector<std::string>& keys) {
    if (keys.empty()) {
      return "foo";
    } else {
      const int index = rnd->Uniform(keys.size());
      std::string result = keys[index];
      switch (rnd->Uniform(3)) {
        case 0:
          // Return an existing key
          break;
        case 1: {
          // Attempt to return something smaller than an existing key
          if (!result.empty() && result[result.size() - 1] > '\0') {
            result[result.size() - 1]--;
          }
          break;
        }
        case 2: {
          // Return something larger than an existing key
          Increment(options_.comparator, &result);
          break;
        }
      }
      return result;
    }
  }